

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecvt.cpp
# Opt level: O0

char * res(result r)

{
  result r_local;
  char *local_8;
  
  switch(r) {
  case ok:
    local_8 = "ok";
    break;
  case partial:
    local_8 = "partial";
    break;
  case error:
    local_8 = "error";
    break;
  case noconv:
    local_8 = "noconv";
    break;
  default:
    local_8 = "error";
  }
  return local_8;
}

Assistant:

char const *res(std::codecvt_base::result r)
{
    switch(r){
    case std::codecvt_base::ok: return "ok";
    case std::codecvt_base::partial: return "partial";
    case std::codecvt_base::error: return "error";
    case std::codecvt_base::noconv: return "noconv";
    default:
        return "error";
    }
}